

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

vm_obj_id_t __thiscall CTcGenTarg::gen_rexpat_obj(CTcGenTarg *this,char *txt,size_t len)

{
  uint id;
  CTcDataStream *this_00;
  CTcDataStream *__n;
  char buf [5];
  vm_val_t val;
  
  this_00 = G_rexpat_stream;
  id = this->next_obj_;
  this->next_obj_ = id + 1;
  CTcParser::add_nonsym_obj(G_prs,id);
  CTcDataStream::write_obj_id(this_00,(ulong)id);
  CTcDataStream::write2(this_00,5);
  __n = this_00;
  add_const_str(this,txt,len,this_00,this_00->ofs_ + 1);
  val.typ = VM_SSTRING;
  val.val.obj = 0;
  vmb_put_dh(buf,&val);
  CTcDataStream::write(this_00,(int)buf,(void *)0x5,(size_t)__n);
  return id;
}

Assistant:

vm_obj_id_t CTcGenTarg::gen_rexpat_obj(const char *txt, size_t len)
{
    /* write to RexPattern object stream */
    CTcDataStream *rs = G_rexpat_stream;

    /* generate a new object ID for the RexPattern object */
    vm_obj_id_t id = new_obj_id();

    /* add the object ID to the non-symbol object list */
    G_prs->add_nonsym_obj(id);

    /* 
     *   write the OBJS header - object ID plus byte count for metaclass data
     *   (a DATAHOLDER pointing to the constant string)
     */
    rs->write_obj_id(id);
    rs->write2(VMB_DATAHOLDER);

    /* 
     *   Add the source text as an ordinary constant string.  Generate its
     *   fixup in the RexPattern stream, in the DATAHOLDER we're about to
     *   write. 
     */
    add_const_str(txt, len, rs, rs->get_ofs() + 1);

    /* 
     *   Set up the constant string value.  Use zero as the pool offset,
     *   since the fixup for the constant string will fill this in when the
     *   pool layout is finalized. 
     */
    vm_val_t val;
    val.set_sstring(0);

    /* write the RexPattern data (a DATAHOLDER for the const string) */
    char buf[VMB_DATAHOLDER];
    vmb_put_dh(buf, &val);
    rs->write(buf, VMB_DATAHOLDER);

    /* return the new object ID */
    return id;
}